

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O1

void __thiscall cmSearchPath::AddCMakePrefixPath(cmSearchPath *this,string *variable)

{
  char *__s;
  size_t sVar1;
  string *psVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string local_38;
  
  if (this->FC != (cmFindCommon *)0x0) {
    __s = cmMakefile::GetDefinition((this->FC->super_cmCommand).Makefile,variable);
    if (__s != (char *)0x0) {
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      sVar1 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,__s,__s + sVar1);
      cmSystemTools::ExpandListArgument(&local_38,&local_58,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                         ((this->FC->super_cmCommand).Makefile);
      AddPrefixPaths(this,&local_58,(psVar2->_M_dataplus)._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
    }
    return;
  }
  __assert_fail("this->FC != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmSearchPath.cxx"
                ,0x66,"void cmSearchPath::AddCMakePrefixPath(const std::string &)");
}

Assistant:

void cmSearchPath::AddCMakePrefixPath(const std::string& variable)
{
  assert(this->FC != nullptr);

  // Get a path from a CMake variable.
  if (const char* value = this->FC->Makefile->GetDefinition(variable)) {
    std::vector<std::string> expanded;
    cmSystemTools::ExpandListArgument(value, expanded);

    this->AddPrefixPaths(
      expanded, this->FC->Makefile->GetCurrentSourceDirectory().c_str());
  }
}